

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O1

TimerId __thiscall
mario::TimerQueue::addTimer(TimerQueue *this,TimerCallback *cb,Timestamp when,double interval)

{
  EventLoop *this_00;
  long lVar1;
  TimerId TVar2;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  TVar2._value = (Timer *)operator_new(0x40);
  std::function<void_()>::function((function<void_()> *)TVar2._value,cb);
  ((TVar2._value)->_expiration)._microSecondsSinceEpoch = when._microSecondsSinceEpoch;
  (TVar2._value)->_interval = interval;
  (TVar2._value)->_repeat = 0.0 < interval;
  LOCK();
  UNLOCK();
  lVar1 = Timer::_s_numCreated._value + 1;
  Timer::_s_numCreated._value = Timer::_s_numCreated._value + 1;
  (TVar2._value)->_sequence = lVar1;
  this_00 = this->_loop;
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_48._M_unused._M_object = operator_new(0x20);
  *(code **)local_48._M_unused._0_8_ = addTimerInLoop;
  *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = 0;
  *(Timer **)((long)local_48._M_unused._0_8_ + 0x10) = TVar2._value;
  *(TimerQueue **)((long)local_48._M_unused._0_8_ + 0x18) = this;
  pcStack_30 = std::
               _Function_handler<void_(),_std::_Bind<void_(mario::TimerQueue::*(mario::TimerQueue_*,_mario::Timer_*))(mario::Timer_*)>_>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(),_std::_Bind<void_(mario::TimerQueue::*(mario::TimerQueue_*,_mario::Timer_*))(mario::Timer_*)>_>
             ::_M_manager;
  EventLoop::runInLoop(this_00,(Functor *)&local_48);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  TVar2._seq = (TVar2._value)->_sequence;
  return TVar2;
}

Assistant:

TimerId TimerQueue::addTimer(const TimerCallback& cb, Timestamp when, double interval) {
    Timer* timer = new Timer(cb, when, interval);
    _loop->runInLoop(
            std::bind(&TimerQueue::addTimerInLoop, this, timer)
            );

    return TimerId(timer, timer->sequence());
}